

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acto.h
# Opt level: O0

enable_if_t<std::is_base_of<_::acto::actor,_Wall>::value,_actor_ref> acto::spawn<Wall>(void)

{
  object_t *an_object;
  object_t *in_RDI;
  unique_ptr<Wall,_std::default_delete<Wall>_> local_28;
  unique_ptr<acto::actor,_std::default_delete<acto::actor>_> local_20;
  actor_ref local_18 [2];
  
  local_18[0].object_ = (object_t *)0x0;
  actor_ref::actor_ref(local_18);
  std::make_unique<Wall>();
  std::unique_ptr<acto::actor,std::default_delete<acto::actor>>::
  unique_ptr<Wall,std::default_delete<Wall>,void>
            ((unique_ptr<acto::actor,std::default_delete<acto::actor>> *)&local_20,&local_28);
  an_object = core::make_instance(local_18,shared,&local_20);
  actor_ref::actor_ref((actor_ref *)in_RDI,an_object,false);
  std::unique_ptr<acto::actor,_std::default_delete<acto::actor>_>::~unique_ptr(&local_20);
  std::unique_ptr<Wall,_std::default_delete<Wall>_>::~unique_ptr(&local_28);
  actor_ref::~actor_ref(local_18);
  return (enable_if_t<std::is_base_of<_::acto::actor,_Wall>::value,_actor_ref>)in_RDI;
}

Assistant:

inline std::enable_if_t<std::is_base_of<::acto::actor, T>::value, actor_ref>
spawn(P&&... p) {
  return actor_ref(
    core::make_instance(actor_ref(), actor_thread::shared,
                        std::make_unique<T>(std::forward<P>(p)...)),
    false);
}